

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O1

int IDABBDPrecInit(void *ida_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dq_rel_yy,IDABBDLocalFn Gres,
                  IDABBDCommFn Gcomm)

{
  double __x;
  long lVar1;
  int iVar2;
  long *__ptr;
  SUNMatrix p_Var3;
  N_Vector p_Var4;
  long lVar5;
  SUNLinearSolver p_Var6;
  long smu;
  long *plVar7;
  int iVar8;
  int error_code;
  char *msgfmt;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar8 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    iVar2 = 0x47;
  }
  else {
    lVar1 = *(long *)((long)ida_mem + 0x418);
    if (lVar1 == 0) {
      msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
      iVar8 = -2;
      error_code = -2;
      iVar2 = 0x50;
    }
    else if (*(long *)(*(long *)(*(long *)((long)ida_mem + 0x1d0) + 8) + 0x28) == 0) {
      msgfmt = "A required vector operation is not implemented.";
      iVar8 = -3;
      error_code = -3;
      iVar2 = 0x59;
    }
    else {
      __ptr = (long *)malloc(0xa0);
      if (__ptr == (long *)0x0) {
        msgfmt = "A memory request failed.";
        iVar8 = -4;
        error_code = -4;
        iVar2 = 99;
      }
      else {
        lVar5 = 0;
        if (mudq < 1) {
          mudq = lVar5;
        }
        smu = Nlocal + -1;
        if (Nlocal <= mudq) {
          mudq = smu;
        }
        __ptr[0x13] = (long)ida_mem;
        if (mldq < 1) {
          mldq = lVar5;
        }
        __ptr[5] = (long)Gres;
        if (Nlocal <= mldq) {
          mldq = smu;
        }
        if (mukeep < 1) {
          mukeep = lVar5;
        }
        __ptr[6] = (long)Gcomm;
        if (Nlocal <= mukeep) {
          mukeep = smu;
        }
        *__ptr = mudq;
        if (mlkeep < 1) {
          mlkeep = lVar5;
        }
        __ptr[1] = mldq;
        if (Nlocal <= mlkeep) {
          mlkeep = smu;
        }
        __ptr[2] = mukeep;
        __ptr[3] = mlkeep;
        if (mlkeep + mukeep < Nlocal) {
          smu = mlkeep + mukeep;
        }
        __ptr[8] = 0;
        p_Var3 = SUNBandMatrixStorage(Nlocal,mukeep,mlkeep,smu,*ida_mem);
        __ptr[8] = (long)p_Var3;
        if (p_Var3 == (SUNMatrix)0x0) {
          free(__ptr);
          msgfmt = "A memory request failed.";
          iVar8 = -4;
          error_code = -4;
          iVar2 = 0x7e;
        }
        else {
          __ptr[10] = 0;
          p_Var4 = N_VNewEmpty_Serial(Nlocal,*ida_mem);
          __ptr[10] = (long)p_Var4;
          if (p_Var4 == (N_Vector)0x0) {
            SUNMatDestroy(__ptr[8]);
            free(__ptr);
            msgfmt = "A memory request failed.";
            iVar8 = -4;
            error_code = -4;
            iVar2 = 0x8b;
          }
          else {
            __ptr[0xb] = 0;
            p_Var4 = N_VNewEmpty_Serial(Nlocal,*ida_mem);
            __ptr[0xb] = (long)p_Var4;
            if (p_Var4 == (N_Vector)0x0) {
              N_VDestroy(__ptr[10]);
              SUNMatDestroy(__ptr[8]);
              free(__ptr);
              msgfmt = "A memory request failed.";
              iVar8 = -4;
              error_code = -4;
              iVar2 = 0x97;
            }
            else {
              __ptr[0xc] = 0;
              lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1d0));
              __ptr[0xc] = lVar5;
              if (lVar5 == 0) {
                N_VDestroy(__ptr[0xb]);
                N_VDestroy(__ptr[10]);
                SUNMatDestroy(__ptr[8]);
                free(__ptr);
                msgfmt = "A memory request failed.";
                iVar8 = -4;
                error_code = -4;
                iVar2 = 0xa4;
              }
              else {
                __ptr[0xd] = 0;
                lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1d0));
                __ptr[0xd] = lVar5;
                if (lVar5 == 0) {
                  N_VDestroy(__ptr[0xb]);
                  N_VDestroy(__ptr[10]);
                  N_VDestroy(__ptr[0xc]);
                  SUNMatDestroy(__ptr[8]);
                  free(__ptr);
                  msgfmt = "A memory request failed.";
                  iVar8 = -4;
                  error_code = -4;
                  iVar2 = 0xb2;
                }
                else {
                  __ptr[0xe] = 0;
                  lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1d0));
                  __ptr[0xe] = lVar5;
                  if (lVar5 == 0) {
                    N_VDestroy(__ptr[0xb]);
                    N_VDestroy(__ptr[10]);
                    N_VDestroy(__ptr[0xc]);
                    N_VDestroy(__ptr[0xd]);
                    SUNMatDestroy(__ptr[8]);
                    free(__ptr);
                    msgfmt = "A memory request failed.";
                    iVar8 = -4;
                    error_code = -4;
                    iVar2 = 0xc1;
                  }
                  else {
                    __ptr[0xf] = 0;
                    lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1d0));
                    __ptr[0xf] = lVar5;
                    if (lVar5 == 0) {
                      N_VDestroy(__ptr[0xb]);
                      N_VDestroy(__ptr[10]);
                      N_VDestroy(__ptr[0xc]);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      free(__ptr);
                      msgfmt = "A memory request failed.";
                      iVar8 = -4;
                      error_code = -4;
                      iVar2 = 0xd1;
                    }
                    else {
                      __ptr[9] = 0;
                      p_Var6 = SUNLinSol_Band((N_Vector)__ptr[0xb],(SUNMatrix)__ptr[8],*ida_mem);
                      __ptr[9] = (long)p_Var6;
                      if (p_Var6 == (SUNLinearSolver)0x0) {
                        N_VDestroy(__ptr[10]);
                        N_VDestroy(__ptr[0xb]);
                        N_VDestroy(__ptr[0xc]);
                        N_VDestroy(__ptr[0xd]);
                        N_VDestroy(__ptr[0xe]);
                        N_VDestroy(__ptr[0xf]);
                        SUNMatDestroy(__ptr[8]);
                        free(__ptr);
                        msgfmt = "A memory request failed.";
                        iVar8 = -4;
                        error_code = -4;
                        iVar2 = 0xe4;
                      }
                      else {
                        iVar2 = SUNLinSolInitialize(p_Var6);
                        if (iVar2 == 0) {
                          if (dq_rel_yy <= 0.0) {
                            __x = *(double *)((long)ida_mem + 8);
                            dq_rel_yy = 0.0;
                            if (0.0 < __x) {
                              if (__x < 0.0) {
                                dq_rel_yy = sqrt(__x);
                              }
                              else {
                                dq_rel_yy = SQRT(__x);
                              }
                            }
                          }
                          __ptr[4] = (long)dq_rel_yy;
                          __ptr[7] = Nlocal;
                          plVar7 = __ptr + 0x10;
                          __ptr[0x10] = 0;
                          __ptr[0x11] = 0;
                          if (*(long *)(*(long *)(*(long *)((long)ida_mem + 0x1d0) + 8) + 0x20) != 0
                             ) {
                            N_VSpace(*(long *)((long)ida_mem + 0x1d0),&local_38,&local_40);
                            *plVar7 = *plVar7 + local_38 * 4;
                            __ptr[0x11] = __ptr[0x11] + local_40 * 4;
                          }
                          if (*(long *)(*(long *)(__ptr[0xb] + 8) + 0x20) != 0) {
                            N_VSpace(__ptr[0xb],&local_38,&local_40);
                            *plVar7 = *plVar7 + local_38 * 2;
                            __ptr[0x11] = __ptr[0x11] + local_40 * 2;
                          }
                          if (*(long *)(*(long *)(__ptr[8] + 8) + 0x50) != 0) {
                            SUNMatSpace(__ptr[8],&local_48,&local_50);
                            __ptr[0x10] = __ptr[0x10] + local_48;
                            __ptr[0x11] = __ptr[0x11] + local_50;
                          }
                          if (*(long *)(*(long *)(__ptr[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(__ptr[9],&local_48,&local_50);
                            __ptr[0x10] = __ptr[0x10] + local_48;
                            __ptr[0x11] = __ptr[0x11] + local_50;
                          }
                          __ptr[0x12] = 0;
                          if (*(code **)(lVar1 + 0x110) != (code *)0x0) {
                            (**(code **)(lVar1 + 0x110))(ida_mem);
                          }
                          *(long **)(lVar1 + 0x118) = __ptr;
                          *(code **)(lVar1 + 0x110) = IDABBDPrecFree;
                          iVar2 = IDASetPreconditioner(ida_mem,IDABBDPrecSetup,IDABBDPrecSolve);
                          return iVar2;
                        }
                        N_VDestroy(__ptr[10]);
                        N_VDestroy(__ptr[0xb]);
                        N_VDestroy(__ptr[0xc]);
                        N_VDestroy(__ptr[0xd]);
                        N_VDestroy(__ptr[0xe]);
                        N_VDestroy(__ptr[0xf]);
                        SUNMatDestroy(__ptr[8]);
                        SUNLinSolFree(__ptr[9]);
                        free(__ptr);
                        msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                        iVar8 = -9;
                        error_code = -9;
                        iVar2 = 0xf7;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDABBDPrecInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_bbdpre.c"
                  ,msgfmt);
  return iVar8;
}

Assistant:

int IDABBDPrecInit(void* ida_mem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dq_rel_yy, IDABBDLocalFn Gres, IDABBDCommFn Gcomm)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if the LS linear solver interface has been created */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (IDA_mem->ida_tempv1->ops->nvgetarraypointer == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGBBD_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Allocate data memory. */
  pdata = NULL;
  pdata = (IBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Set pointers to glocal and gcomm; load half-bandwidths. */
  pdata->ida_mem = IDA_mem;
  pdata->glocal  = Gres;
  pdata->gcomm   = Gcomm;
  pdata->mudq    = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq    = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk            = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk            = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep  = muk;
  pdata->mlkeep  = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting). */
  storage_mu = SUNMIN(Nlocal - 1, muk + mlk);

  /* Allocate memory for preconditioner matrix. */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                   IDA_mem->ida_sunctx);
  if (pdata->PP == NULL)
  {
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, IDA_mem->ida_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, IDA_mem->ida_sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv1 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv2 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv3 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  pdata->tempv4 = NULL;
  pdata->tempv4 = N_VClone(IDA_mem->ida_tempv1);
  if (pdata->tempv4 == NULL)
  {
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->PP, IDA_mem->ida_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    N_VDestroy(pdata->tempv4);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    N_VDestroy(pdata->tempv4);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNLS_FAIL);
    return (IDALS_SUNLS_FAIL);
  }

  /* Set rel_yy based on input value dq_rel_yy (0 implies default). */
  pdata->rel_yy = (dq_rel_yy > ZERO) ? dq_rel_yy : SUNRsqrt(IDA_mem->ida_uround);

  /* Store Nlocal to be used in IDABBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge. */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (IDA_mem->ida_tempv1->ops->nvspace)
  {
    N_VSpace(IDA_mem->ida_tempv1, &lrw1, &liw1);
    pdata->rpwsize += 4 * lrw1;
    pdata->ipwsize += 4 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->PP->ops->space)
  {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (idals_mem->pfree) { idals_mem->pfree(IDA_mem); }

  /* Point to the new pdata field in the LS memory */
  idals_mem->pdata = pdata;

  /* Attach the pfree function */
  idals_mem->pfree = IDABBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = IDASetPreconditioner(ida_mem, IDABBDPrecSetup, IDABBDPrecSolve);

  return (flag);
}